

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_mbe.cpp
# Opt level: O1

void __thiscall DSDcc::DSDMBEDecoder::processAudio(DSDMBEDecoder *this)

{
  char *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  byte bVar5;
  float *pfVar6;
  undefined1 auVar7 [12];
  float fVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  short *psVar12;
  int iVar13;
  short sVar14;
  int iVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (this->m_auto_gain == true) {
    pfVar9 = this->m_audio_out_temp_buf;
    this->m_audio_out_temp_buf_p = pfVar9;
    auVar17 = ZEXT816(0);
    lVar11 = 0x3a;
    do {
      pcVar1 = this->imbe_d + lVar11 * 4 + -8;
      auVar20._0_8_ = *(ulong *)pcVar1 & 0x7fffffff7fffffff;
      auVar20._8_4_ = *(uint *)(pcVar1 + 8) & 0x7fffffff;
      auVar20._12_4_ = *(uint *)(pcVar1 + 0xc) & 0x7fffffff;
      auVar17 = maxps(auVar17,auVar20);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xda);
    auVar7._4_8_ = auVar20._8_8_;
    auVar7._0_4_ = auVar17._4_4_;
    auVar21._0_8_ = auVar7._0_8_ << 0x20;
    auVar21._8_4_ = auVar17._8_4_;
    auVar21._12_4_ = auVar17._12_4_;
    auVar22._8_8_ = auVar17._8_8_;
    auVar22._0_8_ = auVar21._8_8_;
    auVar17 = maxps(auVar22,auVar17);
    fVar18 = auVar17._4_4_;
    if (auVar17._4_4_ <= auVar17._0_4_) {
      fVar18 = auVar17._0_4_;
    }
    this->m_audio_out_temp_buf_p = (float *)&this->m_audio_out_temp_buf_p;
    pfVar6 = this->m_aout_max_buf_p;
    *pfVar6 = fVar18;
    this->m_aout_max_buf_p = pfVar6 + 1;
    iVar10 = this->m_aout_max_buf_idx;
    this->m_aout_max_buf_idx = iVar10 + 1;
    if (0x17 < iVar10) {
      this->m_aout_max_buf_idx = 0;
      this->m_aout_max_buf_p = this->m_aout_max_buf;
    }
    lVar11 = 0;
    do {
      if (fVar18 <= this->m_aout_max_buf[lVar11]) {
        fVar18 = this->m_aout_max_buf[lVar11];
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x19);
    fVar16 = (float)(~-(uint)(0.0 < fVar18) & 0x42480000 |
                    (uint)(30000.0 / fVar18) & -(uint)(0.0 < fVar18));
    fVar18 = this->m_aout_gain;
    if (fVar18 <= fVar16) {
      fVar8 = 50.0;
      if (fVar16 <= 50.0) {
        fVar8 = fVar16;
      }
      fVar16 = fVar8 - fVar18;
      if (fVar18 * 0.05 < fVar8 - fVar18) {
        fVar16 = fVar18 * 0.05;
      }
    }
    else {
      this->m_aout_gain = fVar16;
      fVar16 = 0.0;
    }
    this->m_audio_out_temp_buf_p = pfVar9;
    iVar10 = 0;
    do {
      *pfVar9 = ((float)iVar10 * fVar16 * 0.00625 + this->m_aout_gain) * *pfVar9;
      pfVar9 = pfVar9 + 1;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0xa0);
    this->m_audio_out_temp_buf_p = pfVar9;
    this->m_aout_gain = fVar16 + this->m_aout_gain;
  }
  this->m_audio_out_temp_buf_p = this->m_audio_out_temp_buf;
  iVar10 = this->m_upsample;
  if ((long)iVar10 < 2) {
    if (this->m_audio_out_buf_size <= this->m_audio_out_nb_samples + 0xa0) {
      this->m_audio_out_nb_samples = 0;
      this->m_audio_out_buf_p = this->m_audio_out_buf;
    }
    this->m_audio_out_float_buf_p = this->m_audio_out_float_buf;
    bVar4 = this->m_stereo;
    pfVar9 = this->m_audio_out_temp_buf_p;
    psVar12 = this->m_audio_out_buf_p;
    iVar10 = this->m_audio_out_nb_samples;
    iVar13 = this->m_audio_out_idx;
    iVar15 = this->m_audio_out_idx2;
    lVar11 = 0;
    do {
      uVar19 = 0x46fff000;
      if ((32760.0 < *(float *)((long)pfVar9 + lVar11)) ||
         (uVar19 = 0xc6fff000, *(float *)((long)pfVar9 + lVar11) < -32760.0)) {
        *(undefined4 *)((long)pfVar9 + lVar11) = uVar19;
      }
      sVar14 = (short)(int)*(float *)((long)pfVar9 + lVar11);
      *psVar12 = sVar14;
      if (bVar4 == false) {
        psVar12 = psVar12 + 1;
      }
      else {
        psVar12[1] = sVar14;
        psVar12 = psVar12 + 2;
      }
      lVar11 = lVar11 + 4;
    } while ((int)lVar11 != 0x280);
    this->m_audio_out_temp_buf_p = (float *)((long)pfVar9 + lVar11);
    this->m_audio_out_buf_p = psVar12;
    this->m_audio_out_nb_samples = iVar10 + 0xa0;
    this->m_audio_out_idx = iVar13 + 0xa0;
    this->m_audio_out_idx2 = iVar15 + 0xa0;
  }
  else {
    iVar13 = iVar10 * 0xa0;
    if (this->m_audio_out_buf_size <= this->m_audio_out_nb_samples + iVar13) {
      this->m_audio_out_nb_samples = 0;
      this->m_audio_out_buf_p = this->m_audio_out_buf;
    }
    pfVar9 = this->m_audio_out_float_buf;
    this->m_audio_out_float_buf_p = pfVar9;
    iVar15 = 0xa0;
    do {
      upsample(this,iVar10,*this->m_audio_out_temp_buf_p);
      this->m_audio_out_temp_buf_p = this->m_audio_out_temp_buf_p + 1;
      this->m_audio_out_float_buf_p = this->m_audio_out_float_buf_p + iVar10;
      uVar2 = this->m_audio_out_idx;
      uVar3 = this->m_audio_out_idx2;
      this->m_audio_out_idx = uVar2 + iVar10;
      this->m_audio_out_idx2 = uVar3 + iVar10;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    this->m_audio_out_float_buf_p = pfVar9;
    iVar10 = this->m_audio_out_nb_samples;
    bVar4 = this->m_stereo;
    bVar5 = this->m_channels;
    iVar15 = 1;
    if (1 < iVar13) {
      iVar15 = iVar13;
    }
    psVar12 = this->m_audio_out_buf_p;
    iVar13 = iVar15;
    do {
      fVar18 = 32760.0;
      if ((32760.0 < *pfVar9) || (fVar18 = -32760.0, *pfVar9 < -32760.0)) {
        *pfVar9 = fVar18;
      }
      if (bVar4 == false) {
        *psVar12 = (short)(int)*pfVar9;
        lVar11 = 2;
      }
      else {
        if ((bVar5 & 1) == 0) {
          sVar14 = 0;
        }
        else {
          sVar14 = (short)(int)*pfVar9;
        }
        *psVar12 = sVar14;
        this->m_audio_out_buf_p = psVar12 + 1;
        if ((bVar5 & 2) == 0) {
          sVar14 = 0;
        }
        else {
          sVar14 = (short)(int)*pfVar9;
        }
        psVar12[1] = sVar14;
        lVar11 = 4;
      }
      psVar12 = (short *)((long)psVar12 + lVar11);
      this->m_audio_out_buf_p = psVar12;
      pfVar9 = pfVar9 + 1;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    this->m_audio_out_nb_samples = iVar10 + iVar15;
    this->m_audio_out_float_buf_p = pfVar9;
  }
  return;
}

Assistant:

void DSDMBEDecoder::processAudio()
{
    int i, n;
    float aout_abs, max, gainfactor, gaindelta, maxbuf;

    if (m_auto_gain)
    {
        // detect max level
        max = 0;
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            aout_abs = fabsf(*m_audio_out_temp_buf_p);

            if (aout_abs > max)
            {
                max = aout_abs;
            }

            m_audio_out_temp_buf_p++;
        }

        *m_aout_max_buf_p = max;
        m_aout_max_buf_p++;
        m_aout_max_buf_idx++;

        if (m_aout_max_buf_idx > 24)
        {
            m_aout_max_buf_idx = 0;
            m_aout_max_buf_p = m_aout_max_buf;
        }

        // lookup max history
        for (i = 0; i < 25; i++)
        {
            maxbuf = m_aout_max_buf[i];

            if (maxbuf > max)
            {
                max = maxbuf;
            }
        }

        // determine optimal gain level
        if (max > (float) 0)
        {
            gainfactor = ((float) 30000 / max);
        }
        else
        {
            gainfactor = (float) 50;
        }

        if (gainfactor < m_aout_gain)
        {
            m_aout_gain = gainfactor;
            gaindelta = (float) 0;
        }
        else
        {
            if (gainfactor > (float) 50)
            {
                gainfactor = (float) 50;
            }

            gaindelta = gainfactor - m_aout_gain;

            if (gaindelta > ((float) 0.05 * m_aout_gain))
            {
                gaindelta = ((float) 0.05 * m_aout_gain);
            }
        }

        gaindelta /= (float) 160;

        // adjust output gain
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            *m_audio_out_temp_buf_p = (m_aout_gain
                    + ((float) n * gaindelta)) * (*m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
        }

        m_aout_gain += ((float) 160 * gaindelta);
    }
    else
    {
        gaindelta = (float) 0;
    }

    // copy audio data to output buffer and upsample if necessary
    m_audio_out_temp_buf_p = m_audio_out_temp_buf;

    //if ((m_upsample == 6) || (m_upsample == 7)) // upsampling to 48k
    if (m_upsample >= 2)
    {
        int upsampling = m_upsample;

        if (m_audio_out_nb_samples + (160*upsampling) >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            upsample(upsampling, *m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
            m_audio_out_float_buf_p += upsampling;
            m_audio_out_idx += upsampling;
            m_audio_out_idx2 += upsampling;
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        // copy to output (short) buffer
        for (n = 0; n < (160*upsampling); n++)
        {
            if (*m_audio_out_float_buf_p > (float) 32760)
            {
                *m_audio_out_float_buf_p = (float) 32760;
            }
            else if (*m_audio_out_float_buf_p < (float) -32760)
            {
                *m_audio_out_float_buf_p = (float) -32760;
            }


            if (m_stereo) // produce two channels
            {
            	if (m_channels & 1) { // left channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;

                if ((m_channels>>1) & 1) { // right channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;
            }
            else // single (mono) channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_float_buf_p++;
        }
    }
    else // leave at 8k
    {
        if (m_audio_out_nb_samples + 160 >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            if (*m_audio_out_temp_buf_p > (float) 32760)
            {
                *m_audio_out_temp_buf_p = (float) 32760;
            }
            else if (*m_audio_out_temp_buf_p < (float) -32760)
            {
                *m_audio_out_temp_buf_p = (float) -32760;
            }

            *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
            m_audio_out_buf_p++;

            if (m_stereo) // produce second channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_temp_buf_p++;
            m_audio_out_idx++;
            m_audio_out_idx2++;
        }
    }
}